

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3CodeSubselect(Parse *pParse,Expr *pExpr,int rHasNullFlag,int isRowid)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  sqlite3 *p_00;
  CollSeq *pCVar4;
  Expr *pEVar5;
  int in_ECX;
  char *pcVar6;
  int in_EDX;
  byte *in_RSI;
  Parse *in_RDI;
  Expr *pLimit;
  int nReg;
  SelectDest dest_1;
  Select *pSel;
  int iValToIns;
  Expr *pE2;
  int r3;
  int r2;
  int r1;
  ExprList_item *pItem;
  ExprList *pList;
  int i_1;
  char affinity;
  Expr *p;
  int i;
  SelectDest dest;
  ExprList *pEList;
  Select *pSelect;
  int nVal;
  KeyInfo *pKeyInfo;
  Expr *pLeft;
  int addr;
  Vdbe *v;
  int rReg;
  int jmpIfDynamic;
  SelectDest *in_stack_00000178;
  Select *in_stack_00000180;
  Parse *in_stack_00000188;
  int in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  int in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  int in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  sqlite3 *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  sqlite3 *in_stack_fffffffffffffee0;
  Vdbe *p_01;
  undefined4 in_stack_fffffffffffffee8;
  sqlite3 *pParse_00;
  undefined4 uVar7;
  Parse *in_stack_ffffffffffffff00;
  SelectDest local_f0;
  undefined8 *local_d0;
  undefined8 local_c0;
  int local_b4;
  int local_b0;
  int local_ac;
  int *local_a8;
  int *local_a0;
  int local_98;
  char local_91;
  Expr *local_90;
  int local_84;
  SelectDest local_80;
  int *local_60;
  undefined8 *local_58;
  Vdbe *pVVar8;
  int local_28;
  int local_24;
  int local_4;
  
  local_24 = -1;
  local_28 = 0;
  p_00 = (sqlite3 *)
         sqlite3GetVdbe((Parse *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  if (p_00 == (sqlite3 *)0x0) {
    local_4 = 0;
  }
  else {
    if ((*(uint *)(in_RSI + 4) & 0x20) == 0) {
      local_24 = sqlite3VdbeAddOp0((Vdbe *)CONCAT44(in_stack_fffffffffffffec4,
                                                    in_stack_fffffffffffffec0),
                                   in_stack_fffffffffffffebc);
    }
    uVar1 = (uint)*in_RSI;
    if ((uVar1 == 0x14) || (uVar1 != 0x31)) {
      local_d0 = *(undefined8 **)(in_RSI + 0x20);
      pcVar6 = "CORRELATED ";
      if (-1 < local_24) {
        pcVar6 = "";
      }
      sqlite3VdbeExplain(in_RDI,'\x01',"%sSCALAR SUBQUERY",pcVar6);
      if (*in_RSI == 0x7f) {
        iVar3 = *(int *)*local_d0;
      }
      else {
        iVar3 = 1;
      }
      iVar2 = iVar3;
      sqlite3SelectDestInit(&local_f0,0,in_RDI->nMem + 1);
      in_RDI->nMem = iVar3 + in_RDI->nMem;
      if (*in_RSI == 0x7f) {
        local_f0.eDest = '\n';
        local_f0.iSdst = local_f0.iSDParm;
        local_f0.nSdst = iVar3;
        sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                          (int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                          (int)in_stack_fffffffffffffed0,iVar2,in_stack_fffffffffffffec8);
      }
      else {
        local_f0.eDest = '\x03';
        sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                          in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8,0);
      }
      pEVar5 = sqlite3ExprAlloc(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                                (Token *)in_stack_fffffffffffffed0,iVar2);
      if (local_d0[0xc] == 0) {
        pEVar5 = sqlite3PExpr((Parse *)in_stack_fffffffffffffed0,iVar2,
                              (Expr *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                              (Expr *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8))
        ;
        local_d0[0xc] = pEVar5;
      }
      else {
        sqlite3ExprDelete((sqlite3 *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                          (Expr *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        *(Expr **)(local_d0[0xc] + 0x10) = pEVar5;
      }
      *(undefined4 *)(local_d0 + 2) = 0;
      iVar3 = sqlite3Select(in_stack_00000188,in_stack_00000180,in_stack_00000178);
      if (iVar3 != 0) {
        return 0;
      }
      local_28 = local_f0.iSDParm;
    }
    else {
      iVar2 = sqlite3ExprVectorSize(*(Expr **)(in_RSI + 0x10));
      iVar3 = in_RDI->nTab;
      in_RDI->nTab = iVar3 + 1;
      *(int *)(in_RSI + 0x2c) = iVar3;
      uVar7 = *(undefined4 *)(in_RSI + 0x2c);
      iVar3 = iVar2;
      if (in_ECX != 0) {
        iVar3 = 0;
      }
      pParse_00 = p_00;
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                        in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8,0);
      if (in_ECX == 0) {
        p_01 = (Vdbe *)sqlite3KeyInfoAlloc(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
                                           in_stack_fffffffffffffec8);
      }
      else {
        p_01 = (Vdbe *)0x0;
      }
      pVVar8 = p_01;
      if ((*(uint *)(in_RSI + 4) & 0x800) == 0) {
        if (*(long *)(in_RSI + 0x20) != 0) {
          local_a0 = *(int **)(in_RSI + 0x20);
          local_91 = sqlite3ExprAffinity((Expr *)CONCAT44(in_stack_fffffffffffffebc,
                                                          in_stack_fffffffffffffeb8));
          if (local_91 == '\0') {
            local_91 = 'A';
          }
          if (pVVar8 != (Vdbe *)0x0) {
            pCVar4 = sqlite3ExprCollSeq((Parse *)pParse_00,
                                        (Expr *)CONCAT44(iVar3,in_stack_fffffffffffffee8));
            *(CollSeq **)&pVVar8->nVar = pCVar4;
          }
          local_ac = sqlite3GetTempReg(in_RDI);
          local_b0 = sqlite3GetTempReg(in_RDI);
          if (in_ECX != 0) {
            in_stack_fffffffffffffeb8 = -1;
            sqlite3VdbeAddOp4((Vdbe *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
                              in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,
                              in_stack_fffffffffffffec0,
                              (char *)CONCAT44(in_stack_fffffffffffffebc,0xffffffff),(int)p_01);
          }
          local_a8 = local_a0 + 2;
          for (local_98 = *local_a0; 0 < local_98; local_98 = local_98 + -1) {
            local_c0 = *(undefined8 *)local_a8;
            if ((-1 < local_24) && (iVar3 = sqlite3ExprIsConstant((Expr *)0x1a0009), iVar3 == 0)) {
              sqlite3VdbeChangeToNoop
                        ((Vdbe *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                         in_stack_fffffffffffffec4);
              local_24 = -1;
            }
            if ((in_ECX == 0) ||
               (iVar3 = sqlite3ExprIsInteger
                                  ((Expr *)CONCAT44(in_stack_fffffffffffffecc,
                                                    in_stack_fffffffffffffec8),
                                   (int *)CONCAT44(in_stack_fffffffffffffec4,
                                                   in_stack_fffffffffffffec0)), iVar3 == 0)) {
              iVar3 = sqlite3ExprCodeTarget((Parse *)pList,(Expr *)pItem,r1);
              local_b4 = iVar3;
              if (in_ECX == 0) {
                in_stack_fffffffffffffeb8 = 1;
                sqlite3VdbeAddOp4((Vdbe *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
                                  in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,
                                  in_stack_fffffffffffffec0,
                                  (char *)CONCAT44(in_stack_fffffffffffffebc,1),(int)p_01);
                sqlite3VdbeAddOp4Int
                          ((Vdbe *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
                           in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,
                           in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
              }
              else {
                in_stack_fffffffffffffed0 = p_00;
                sqlite3VdbeCurrentAddr((Vdbe *)p_00);
                sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffec4,
                                                   in_stack_fffffffffffffec0),
                                  in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8,0);
                sqlite3VdbeAddOp3((Vdbe *)CONCAT44(iVar3,in_stack_fffffffffffffed8),
                                  (int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                                  (int)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
                                  in_stack_fffffffffffffec8);
                in_stack_fffffffffffffedc = iVar3;
              }
            }
            else {
              sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8
                                                ),(int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                                (int)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
                                in_stack_fffffffffffffec8);
            }
            local_a8 = local_a8 + 8;
          }
          sqlite3ReleaseTempReg(in_RDI,local_ac);
          sqlite3ReleaseTempReg(in_RDI,local_b0);
        }
      }
      else {
        local_58 = *(undefined8 **)(in_RSI + 0x20);
        local_60 = (int *)*local_58;
        pcVar6 = "CORRELATED ";
        if (-1 < local_24) {
          pcVar6 = "";
        }
        sqlite3VdbeExplain(in_RDI,'\x01',"%sLIST SUBQUERY",pcVar6);
        if (*local_60 == iVar2) {
          sqlite3SelectDestInit(&local_80,0xb,*(int *)(in_RSI + 0x2c));
          local_80.zAffSdst =
               exprINAffinity(in_stack_ffffffffffffff00,(Expr *)CONCAT44(uVar1,uVar7));
          *(undefined4 *)(local_58 + 2) = 0;
          iVar3 = sqlite3Select(in_stack_00000188,in_stack_00000180,in_stack_00000178);
          if (iVar3 != 0) {
            sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                          (void *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
            sqlite3KeyInfoUnref((KeyInfo *)0x19fe06);
            return 0;
          }
          sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                        (void *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
          for (local_84 = 0; local_84 < iVar2; local_84 = local_84 + 1) {
            local_90 = sqlite3VectorFieldSubexpr
                                 ((Expr *)CONCAT44(in_stack_fffffffffffffebc,
                                                   in_stack_fffffffffffffeb8),0);
            pCVar4 = sqlite3BinaryCompareCollSeq
                               ((Parse *)in_stack_fffffffffffffed0,
                                (Expr *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8
                                                ),
                                (Expr *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0
                                                ));
            *(CollSeq **)((long)&pVVar8->nVar + (long)local_84 * 8) = pCVar4;
          }
        }
      }
      if (pVVar8 != (Vdbe *)0x0) {
        sqlite3VdbeChangeP4(p_01,in_stack_fffffffffffffedc,(char *)in_stack_fffffffffffffed0,
                            in_stack_fffffffffffffecc);
      }
    }
    if (in_EDX != 0) {
      sqlite3SetHasNullFlag
                ((Vdbe *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8);
    }
    if (-1 < local_24) {
      sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                          in_stack_fffffffffffffebc);
    }
    local_4 = local_28;
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3CodeSubselect(
  Parse *pParse,          /* Parsing context */
  Expr *pExpr,            /* The IN, SELECT, or EXISTS operator */
  int rHasNullFlag,       /* Register that records whether NULLs exist in RHS */
  int isRowid             /* If true, LHS of IN operator is a rowid */
){
  int jmpIfDynamic = -1;                      /* One-time test address */
  int rReg = 0;                           /* Register storing resulting */
  Vdbe *v = sqlite3GetVdbe(pParse);
  if( NEVER(v==0) ) return 0;

  /* The evaluation of the IN/EXISTS/SELECT must be repeated every time it
  ** is encountered if any of the following is true:
  **
  **    *  The right-hand side is a correlated subquery
  **    *  The right-hand side is an expression list containing variables
  **    *  We are inside a trigger
  **
  ** If all of the above are false, then we can run this code just once
  ** save the results, and reuse the same result on subsequent invocations.
  */
  if( !ExprHasProperty(pExpr, EP_VarSelect) ){
    jmpIfDynamic = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
  }

  switch( pExpr->op ){
    case TK_IN: {
      int addr;                   /* Address of OP_OpenEphemeral instruction */
      Expr *pLeft = pExpr->pLeft; /* the LHS of the IN operator */
      KeyInfo *pKeyInfo = 0;      /* Key information */
      int nVal;                   /* Size of vector pLeft */
      
      nVal = sqlite3ExprVectorSize(pLeft);
      assert( !isRowid || nVal==1 );

      /* Whether this is an 'x IN(SELECT...)' or an 'x IN(<exprlist>)'
      ** expression it is handled the same way.  An ephemeral table is 
      ** filled with index keys representing the results from the 
      ** SELECT or the <exprlist>.
      **
      ** If the 'x' expression is a column value, or the SELECT...
      ** statement returns a column value, then the affinity of that
      ** column is used to build the index keys. If both 'x' and the
      ** SELECT... statement are columns, then numeric affinity is used
      ** if either column has NUMERIC or INTEGER affinity. If neither
      ** 'x' nor the SELECT... statement are columns, then numeric affinity
      ** is used.
      */
      pExpr->iTable = pParse->nTab++;
      addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, 
          pExpr->iTable, (isRowid?0:nVal));
      pKeyInfo = isRowid ? 0 : sqlite3KeyInfoAlloc(pParse->db, nVal, 1);

      if( ExprHasProperty(pExpr, EP_xIsSelect) ){
        /* Case 1:     expr IN (SELECT ...)
        **
        ** Generate code to write the results of the select into the temporary
        ** table allocated and opened above.
        */
        Select *pSelect = pExpr->x.pSelect;
        ExprList *pEList = pSelect->pEList;

        ExplainQueryPlan((pParse, 1, "%sLIST SUBQUERY",
            jmpIfDynamic>=0?"":"CORRELATED "
        ));
        assert( !isRowid );
        /* If the LHS and RHS of the IN operator do not match, that
        ** error will have been caught long before we reach this point. */
        if( ALWAYS(pEList->nExpr==nVal) ){
          SelectDest dest;
          int i;
          sqlite3SelectDestInit(&dest, SRT_Set, pExpr->iTable);
          dest.zAffSdst = exprINAffinity(pParse, pExpr);
          pSelect->iLimit = 0;
          testcase( pSelect->selFlags & SF_Distinct );
          testcase( pKeyInfo==0 ); /* Caused by OOM in sqlite3KeyInfoAlloc() */
          if( sqlite3Select(pParse, pSelect, &dest) ){
            sqlite3DbFree(pParse->db, dest.zAffSdst);
            sqlite3KeyInfoUnref(pKeyInfo);
            return 0;
          }
          sqlite3DbFree(pParse->db, dest.zAffSdst);
          assert( pKeyInfo!=0 ); /* OOM will cause exit after sqlite3Select() */
          assert( pEList!=0 );
          assert( pEList->nExpr>0 );
          assert( sqlite3KeyInfoIsWriteable(pKeyInfo) );
          for(i=0; i<nVal; i++){
            Expr *p = sqlite3VectorFieldSubexpr(pLeft, i);
            pKeyInfo->aColl[i] = sqlite3BinaryCompareCollSeq(
                pParse, p, pEList->a[i].pExpr
            );
          }
        }
      }else if( ALWAYS(pExpr->x.pList!=0) ){
        /* Case 2:     expr IN (exprlist)
        **
        ** For each expression, build an index key from the evaluation and
        ** store it in the temporary table. If <expr> is a column, then use
        ** that columns affinity when building index keys. If <expr> is not
        ** a column, use numeric affinity.
        */
        char affinity;            /* Affinity of the LHS of the IN */
        int i;
        ExprList *pList = pExpr->x.pList;
        struct ExprList_item *pItem;
        int r1, r2, r3;
        affinity = sqlite3ExprAffinity(pLeft);
        if( !affinity ){
          affinity = SQLITE_AFF_BLOB;
        }
        if( pKeyInfo ){
          assert( sqlite3KeyInfoIsWriteable(pKeyInfo) );
          pKeyInfo->aColl[0] = sqlite3ExprCollSeq(pParse, pExpr->pLeft);
        }

        /* Loop through each expression in <exprlist>. */
        r1 = sqlite3GetTempReg(pParse);
        r2 = sqlite3GetTempReg(pParse);
        if( isRowid ) sqlite3VdbeAddOp4(v, OP_Blob, 0, r2, 0, "", P4_STATIC);
        for(i=pList->nExpr, pItem=pList->a; i>0; i--, pItem++){
          Expr *pE2 = pItem->pExpr;
          int iValToIns;

          /* If the expression is not constant then we will need to
          ** disable the test that was generated above that makes sure
          ** this code only executes once.  Because for a non-constant
          ** expression we need to rerun this code each time.
          */
          if( jmpIfDynamic>=0 && !sqlite3ExprIsConstant(pE2) ){
            sqlite3VdbeChangeToNoop(v, jmpIfDynamic);
            jmpIfDynamic = -1;
          }

          /* Evaluate the expression and insert it into the temp table */
          if( isRowid && sqlite3ExprIsInteger(pE2, &iValToIns) ){
            sqlite3VdbeAddOp3(v, OP_InsertInt, pExpr->iTable, r2, iValToIns);
          }else{
            r3 = sqlite3ExprCodeTarget(pParse, pE2, r1);
            if( isRowid ){
              sqlite3VdbeAddOp2(v, OP_MustBeInt, r3,
                                sqlite3VdbeCurrentAddr(v)+2);
              VdbeCoverage(v);
              sqlite3VdbeAddOp3(v, OP_Insert, pExpr->iTable, r2, r3);
            }else{
              sqlite3VdbeAddOp4(v, OP_MakeRecord, r3, 1, r2, &affinity, 1);
              sqlite3VdbeAddOp4Int(v, OP_IdxInsert, pExpr->iTable, r2, r3, 1);
            }
          }
        }
        sqlite3ReleaseTempReg(pParse, r1);
        sqlite3ReleaseTempReg(pParse, r2);
      }
      if( pKeyInfo ){
        sqlite3VdbeChangeP4(v, addr, (void *)pKeyInfo, P4_KEYINFO);
      }
      break;
    }

    case TK_EXISTS:
    case TK_SELECT:
    default: {
      /* Case 3:    (SELECT ... FROM ...)
      **     or:    EXISTS(SELECT ... FROM ...)
      **
      ** For a SELECT, generate code to put the values for all columns of
      ** the first row into an array of registers and return the index of
      ** the first register.
      **
      ** If this is an EXISTS, write an integer 0 (not exists) or 1 (exists)
      ** into a register and return that register number.
      **
      ** In both cases, the query is augmented with "LIMIT 1".  Any 
      ** preexisting limit is discarded in place of the new LIMIT 1.
      */
      Select *pSel;                         /* SELECT statement to encode */
      SelectDest dest;                      /* How to deal with SELECT result */
      int nReg;                             /* Registers to allocate */
      Expr *pLimit;                         /* New limit expression */

      testcase( pExpr->op==TK_EXISTS );
      testcase( pExpr->op==TK_SELECT );
      assert( pExpr->op==TK_EXISTS || pExpr->op==TK_SELECT );
      assert( ExprHasProperty(pExpr, EP_xIsSelect) );

      pSel = pExpr->x.pSelect;
      ExplainQueryPlan((pParse, 1, "%sSCALAR SUBQUERY",
            jmpIfDynamic>=0?"":"CORRELATED "));
      nReg = pExpr->op==TK_SELECT ? pSel->pEList->nExpr : 1;
      sqlite3SelectDestInit(&dest, 0, pParse->nMem+1);
      pParse->nMem += nReg;
      if( pExpr->op==TK_SELECT ){
        dest.eDest = SRT_Mem;
        dest.iSdst = dest.iSDParm;
        dest.nSdst = nReg;
        sqlite3VdbeAddOp3(v, OP_Null, 0, dest.iSDParm, dest.iSDParm+nReg-1);
        VdbeComment((v, "Init subquery result"));
      }else{
        dest.eDest = SRT_Exists;
        sqlite3VdbeAddOp2(v, OP_Integer, 0, dest.iSDParm);
        VdbeComment((v, "Init EXISTS result"));
      }
      pLimit = sqlite3ExprAlloc(pParse->db, TK_INTEGER,&sqlite3IntTokens[1], 0);
      if( pSel->pLimit ){
        sqlite3ExprDelete(pParse->db, pSel->pLimit->pLeft);
        pSel->pLimit->pLeft = pLimit;
      }else{
        pSel->pLimit = sqlite3PExpr(pParse, TK_LIMIT, pLimit, 0);
      }
      pSel->iLimit = 0;
      if( sqlite3Select(pParse, pSel, &dest) ){
        return 0;
      }
      rReg = dest.iSDParm;
      ExprSetVVAProperty(pExpr, EP_NoReduce);
      break;
    }
  }

  if( rHasNullFlag ){
    sqlite3SetHasNullFlag(v, pExpr->iTable, rHasNullFlag);
  }

  if( jmpIfDynamic>=0 ){
    sqlite3VdbeJumpHere(v, jmpIfDynamic);
  }

  return rReg;
}